

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mouse_cursor.c
# Opt level: O2

_Bool al_set_mouse_cursor(ALLEGRO_DISPLAY *display,ALLEGRO_MOUSE_CURSOR *cursor)

{
  _Bool _Var1;
  
  if (display == (ALLEGRO_DISPLAY *)0x0 || cursor == (ALLEGRO_MOUSE_CURSOR *)0x0) {
    return false;
  }
  _Var1 = (*display->vt->set_mouse_cursor)(display,cursor);
  return _Var1;
}

Assistant:

bool al_set_mouse_cursor(ALLEGRO_DISPLAY *display, ALLEGRO_MOUSE_CURSOR *cursor)
{
   if (!cursor) {
      return false;
   }

   if (display) {
      ASSERT(display->vt->set_mouse_cursor);
      return display->vt->set_mouse_cursor(display, cursor);
   }

   return false;
}